

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O2

void __thiscall
checker_texture::checker_texture
          (checker_texture *this,shared_ptr<texture> *t0,shared_ptr<texture> *t1)

{
  (this->super_texture)._vptr_texture = (_func_int **)&PTR_value_0012c710;
  std::__shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->odd).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>,
             &t0->super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->even).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>,
             &t1->super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

checker_texture(shared_ptr<texture> t0, shared_ptr<texture> t1) : odd(t0), even(t1) {}